

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedMaterialization::UpdateAggregateStats
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  pointer __p;
  bool bVar1;
  pointer pLVar2;
  reference this_00;
  LogicalAggregate *pLVar3;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  *this_01;
  reference this_02;
  type this_03;
  BoundColumnRefExpression *pBVar4;
  reference pvVar5;
  pointer rhs;
  iterator iVar6;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_04;
  ulong __n;
  pointer local_40;
  element_type *local_38;
  
  local_38 = (element_type *)this;
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  if (pLVar2->type == LOGICAL_PROJECTION) {
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&pLVar2->children,0);
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this_00);
    pLVar3 = LogicalOperator::Cast<duckdb::LogicalAggregate>(pLVar2);
    this_01 = &pLVar3->group_stats;
    for (__n = 0; __n < (ulong)((long)(pLVar3->groups).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pLVar3->groups).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1
        ) {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&pLVar3->groups,__n);
      this_03 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_02);
      if ((this_03->super_BaseExpression).type == BOUND_COLUMN_REF) {
        pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&this_03->super_BaseExpression);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                 ::get<true>(this_01,__n);
        if ((pvVar5->
            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>).
            _M_t.
            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
            (BaseStatistics *)0x0) {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                   ::get<true>(this_01,__n);
          rhs = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->(pvVar5);
          bVar1 = LogicalType::operator==(&(pBVar4->super_Expression).return_type,&rhs->type);
          if (!bVar1) {
            iVar6 = ::std::
                    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(local_38->alias)._M_string_length,&pBVar4->binding);
            if ((iVar6.
                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                 ._M_cur != (__node_type *)0x0) &&
               (*(long *)((long)iVar6.
                                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                ._M_cur + 0x18) != 0)) {
              unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                     ._M_cur + 0x18));
              BaseStatistics::ToUnique((BaseStatistics *)&local_40);
              this_04 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                         *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                           ::get<true>(this_01,__n);
              __p = local_40;
              local_40 = (pointer)0x0;
              ::std::
              __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ::reset(this_04,__p);
              ::std::
              unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
              ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                           *)&local_40);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompressedMaterialization::UpdateAggregateStats(unique_ptr<LogicalOperator> &op) {
	if (op->type != LogicalOperatorType::LOGICAL_PROJECTION) {
		return;
	}

	// Update aggregate group stats if compressed
	auto &compressed_aggregate = op->children[0]->Cast<LogicalAggregate>();
	auto &groups = compressed_aggregate.groups;
	auto &group_stats = compressed_aggregate.group_stats;

	for (idx_t group_idx = 0; group_idx < groups.size(); group_idx++) {
		auto &group_expr = *groups[group_idx];
		if (group_expr.GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			continue;
		}
		auto &colref = group_expr.Cast<BoundColumnRefExpression>();
		if (!group_stats[group_idx]) {
			continue;
		}
		if (colref.return_type == group_stats[group_idx]->GetType()) {
			continue;
		}
		auto it = statistics_map.find(colref.binding);
		if (it != statistics_map.end() && it->second) {
			group_stats[group_idx] = it->second->ToUnique();
		}
	}
}